

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-object.c
# Opt level: O0

void fmt_array(hd_context *ctx,fmt *fmt,pdf_obj *obj)

{
  int iVar1;
  pdf_obj *ppVar2;
  int local_24;
  int n;
  int i;
  pdf_obj *obj_local;
  fmt *fmt_local;
  hd_context *ctx_local;
  
  iVar1 = pdf_array_len(ctx,obj);
  if (fmt->tight == 0) {
    fmt_putc(ctx,fmt,0x5b);
    fmt->indent = fmt->indent + 1;
    for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
      if (fmt->col < 0x3d) {
        fmt_putc(ctx,fmt,0x20);
      }
      else {
        fmt_putc(ctx,fmt,10);
        fmt_indent(ctx,fmt);
      }
      ppVar2 = pdf_array_get(ctx,obj,local_24);
      fmt_obj(ctx,fmt,ppVar2);
    }
    fmt->indent = fmt->indent + -1;
    fmt_putc(ctx,fmt,0x20);
    fmt_putc(ctx,fmt,0x5d);
    fmt_sep(ctx,fmt);
  }
  else {
    fmt_putc(ctx,fmt,0x5b);
    for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
      ppVar2 = pdf_array_get(ctx,obj,local_24);
      fmt_obj(ctx,fmt,ppVar2);
      fmt_sep(ctx,fmt);
    }
    fmt_putc(ctx,fmt,0x5d);
  }
  return;
}

Assistant:

static void fmt_array(hd_context *ctx, struct fmt *fmt, pdf_obj *obj)
{
    int i, n;

    n = pdf_array_len(ctx, obj);
    if (fmt->tight) {
        fmt_putc(ctx, fmt, '[');
        for (i = 0; i < n; i++) {
            fmt_obj(ctx, fmt, pdf_array_get(ctx, obj, i));
            fmt_sep(ctx, fmt);
        }
        fmt_putc(ctx, fmt, ']');
    }
    else {
        fmt_putc(ctx, fmt, '[');
        fmt->indent ++;
        for (i = 0; i < n; i++) {
            if (fmt->col > 60) {
                fmt_putc(ctx, fmt, '\n');
                fmt_indent(ctx, fmt);
            } else {
                fmt_putc(ctx, fmt, ' ');
            }
            fmt_obj(ctx, fmt, pdf_array_get(ctx, obj, i));
        }
        fmt->indent --;
        fmt_putc(ctx, fmt, ' ');
        fmt_putc(ctx, fmt, ']');
        fmt_sep(ctx, fmt);
    }
}